

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O1

slReturn ubxGetVersion(int fdPort,int verbosity,ubxVersion *version)

{
  int iVar1;
  ubxMsg pollMsg;
  ubxMsg msg_00;
  _Bool _Var2;
  ubxChecksum uVar3;
  slBuffer *psVar4;
  slReturn pvVar5;
  byte *source;
  char *pcVar6;
  size_t sVar7;
  char ***pppcVar8;
  char **ppcVar9;
  int iVar10;
  long lVar11;
  ubxMsg msg;
  ubxMsg versionMsg;
  undefined6 uStack_56;
  undefined2 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffba;
  undefined8 in_stack_ffffffffffffffc0;
  slBuffer *local_38;
  
  psVar4 = create_slBuffer(0,LittleEndian);
  msg_00.body._0_2_ = in_stack_ffffffffffffffb8;
  msg_00._0_8_ = psVar4;
  msg_00.body._2_6_ = in_stack_ffffffffffffffba;
  msg_00.checksum.ck_a = SUB82(in_stack_ffffffffffffffc0,0).class;
  msg_00.checksum.ck_b = SUB82(in_stack_ffffffffffffffc0,0).id;
  msg_00._18_6_ = SUB86(in_stack_ffffffffffffffc0,2);
  uVar3 = calcFletcherChecksum(msg_00);
  pollMsg._18_6_ = in_stack_ffffffffffffffba;
  pollMsg.checksum = uVar3;
  pollMsg._2_6_ = uStack_56;
  pollMsg.type.class = '\n';
  pollMsg.type.id = '\x04';
  pollMsg.body = psVar4;
  pvVar5 = pollUbx(fdPort,pollMsg,2000,(ubxMsg *)&stack0xffffffffffffffc0);
  _Var2 = isErrorReturn(pvVar5);
  if (_Var2) {
    return pvVar5;
  }
  source = buffer_slBuffer(local_38);
  pcVar6 = getAllocatedStringCopy((char *)source);
  version->software = pcVar6;
  pcVar6 = getAllocatedStringCopy((char *)(source + 0x1e));
  version->hardware = pcVar6;
  sVar7 = size_slBuffer(local_38);
  iVar1 = (int)sVar7;
  iVar10 = (int)((ulong)((long)(iVar1 + -0x28) * -0x77777777) >> 0x20) + iVar1 + -0x28;
  iVar10 = (iVar10 >> 4) - (iVar10 >> 0x1f);
  version->number_of_extensions = iVar10;
  if (iVar1 - 0xbU < 0x3b) {
    pppcVar8 = &version->extensions;
  }
  else {
    pppcVar8 = (char ***)safeMalloc((long)iVar10 << 3);
    version->extensions = (char **)pppcVar8;
    sVar7 = size_slBuffer(local_38);
    if (0x28 < (int)sVar7) {
      lVar11 = 0x28;
      do {
        ppcVar9 = (char **)getAllocatedStringCopy((char *)(source + lVar11));
        *pppcVar8 = ppcVar9;
        pppcVar8 = pppcVar8 + 1;
        lVar11 = lVar11 + 0x1e;
        sVar7 = size_slBuffer(local_38);
      } while ((int)lVar11 < (int)sVar7);
    }
  }
  *pppcVar8 = (char **)0x0;
  pvVar5 = makeOkReturn();
  return pvVar5;
}

Assistant:

extern slReturn ubxGetVersion(int fdPort, int verbosity, ubxVersion* version) {

    ubxType type = { UBX_MON, UBX_MON_VER };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(type, body);
    ubxMsg versionMsg;
    slReturn result = pollUbx(fdPort, msg, MON_VER_MAX_MS, &versionMsg);
    if (isErrorReturn(result)) return result;

    // decode the message and print the results...
    char* buf = (char *) buffer_slBuffer(versionMsg.body);

    version->software = getAllocatedStringCopy(buf);
    version->hardware = getAllocatedStringCopy(buf + 30);

    // calculate the number of extension entries we have...
    int ne = ((int) size_slBuffer(versionMsg.body) - 40) / 30;
    version->number_of_extensions = ne;
    if (ne == 0)
        version->extensions = NULL;
    else {
        version->extensions = safeMalloc((size_t) (sizeof(buf) * ne));
        char** ptr = version->extensions;
        for (int i = 40; i < (int) size_slBuffer(versionMsg.body); i += 30) {
            *ptr = getAllocatedStringCopy(buf + i);
            ptr++;
        }
        *ptr = NULL;
    }

    return makeOkReturn();
}